

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void compact_vector_suite::test_int8_many(void)

{
  initializer_list<signed_char> __l;
  iterator iVar1;
  iterator iVar2;
  undefined4 local_fc;
  undefined2 local_f8;
  undefined1 local_f6;
  allocator<signed_char> local_f5;
  output_type expected [6];
  undefined1 local_e0 [8];
  vector<signed_char,_std::allocator<signed_char>_> value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  expected[0] = '\0';
  expected[1] = '\x7f';
  expected[2] = 0x80;
  expected[3] = 0xff;
  unique0x00004880 = expected;
  std::allocator<signed_char>::allocator(&local_f5);
  __l._M_len = 4;
  __l._M_array = (iterator)stack0xffffffffffffff10;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)local_e0,__l,&local_f5);
  std::allocator<signed_char>::~allocator(&local_f5);
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (vector<signed_char,_std::allocator<signed_char>_> *)local_e0);
  local_f8 = 0xff80;
  local_fc = 0x7f0004a8;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0x1aa,"void compact_vector_suite::test_int8_many()",iVar1._M_current,iVar2._M_current,
             &local_fc,&local_f6);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)local_e0);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_int8_many()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::vector<std::int8_t> value{0x00, 0x7F, -0x80, -0x01};
    ar << value;

    output_type expected[] = { token::code::array8_int8, 0x04, 0x00, 0x7F, 0x80, 0xFF };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}